

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O2

void __thiscall
Diligent::DynamicLinearAllocator::DynamicLinearAllocator
          (DynamicLinearAllocator *this,IMemoryAllocator *Allocator,Uint32 BlockSize)

{
  char (*in_R8) [22];
  Uint32 BlockSize_local;
  string msg;
  
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_BlockSize = BlockSize;
  this->m_pAllocator = Allocator;
  if ((BlockSize ^ BlockSize - 1) <= BlockSize - 1) {
    BlockSize_local = BlockSize;
    FormatString<char[13],unsigned_int,char[22]>
              (&msg,(Diligent *)"Block size (",(char (*) [13])&BlockSize_local,
               (uint *)") is not power of two",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DynamicLinearAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

explicit DynamicLinearAllocator(IMemoryAllocator& Allocator, Uint32 BlockSize = 4 << 10) :
        m_BlockSize{BlockSize},
        m_pAllocator{&Allocator}
    {
        VERIFY(IsPowerOfTwo(BlockSize), "Block size (", BlockSize, ") is not power of two");
    }